

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

void wallet::DiscourageFeeSniping
               (CMutableTransaction *tx,FastRandomContext *rng_fast,Chain *chain,uint256 *block_hash
               ,int block_height)

{
  ulong uVar1;
  Chain *pCVar2;
  char cVar3;
  uint32_t uVar4;
  int64_t iVar5;
  pointer pCVar6;
  uint64_t uVar7;
  Chain *pCVar8;
  uint32_t uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  int64_t block_time;
  bool local_91;
  ulong local_90 [3];
  ulong *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __assert_fail("!tx.vin.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                  ,0x3af,
                  "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
                 );
  }
  cVar3 = (**(code **)(*(long *)chain + 0x118))(chain);
  if (cVar3 == '\0') {
    uStack_70 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_90[1] = 0;
    local_90[2] = 0;
    local_78 = local_90;
    local_91 = (bool)(**(code **)(*(long *)chain + 0x50))(chain,block_hash);
    inline_check_non_fatal<bool>
              (&local_91,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
               ,0x3a0,"IsCurrentForAntiFeeSniping",
               "chain.findBlock(block_hash, FoundBlock().time(block_time))");
    iVar5 = GetTime();
    if (iVar5 + -0x7080 <= (long)local_90[0]) {
      tx->nLockTime = block_height;
      uVar10 = local_90[0];
      do {
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&rng_fast->super_RandomMixin<FastRandomContext>,4);
        uVar1 = uVar10;
        if (9 >= uVar7) {
          uVar1 = uVar7;
        }
        uVar10 = uVar1 & 0xffffffff;
      } while (9 < uVar7);
      if ((int)uVar1 == 0) {
        uVar9 = tx->nLockTime;
        do {
          pCVar8 = (Chain *)RandomMixin<FastRandomContext>::randbits
                                      (&rng_fast->super_RandomMixin<FastRandomContext>,7);
          pCVar2 = chain;
          if ((Chain *)0x63 >= pCVar8) {
            pCVar2 = pCVar8;
          }
          chain = (Chain *)((ulong)pCVar2 & 0xffffffff);
        } while ((Chain *)0x63 < pCVar8);
        uVar9 = uVar9 - (int)pCVar2;
        uVar4 = 0;
        if (0 < (int)uVar9) {
          uVar4 = uVar9;
        }
        tx->nLockTime = uVar4;
      }
      goto LAB_0024707e;
    }
  }
  tx->nLockTime = 0;
LAB_0024707e:
  if (499999999 < tx->nLockTime) {
    __assert_fail("tx.nLockTime < LOCKTIME_THRESHOLD",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                  ,0x3d5,
                  "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
                 );
  }
  if ((uint)block_height < tx->nLockTime) {
    __assert_fail("tx.nLockTime <= uint64_t(block_height)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                  ,0x3d6,
                  "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
                 );
  }
  pCVar6 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pCVar6 == (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    if (1 < pCVar6->nSequence + 3) break;
    pCVar6 = pCVar6 + 1;
  }
  if (pCVar6->nSequence == 0xffffffff) {
    __assert_fail("in.nSequence != CTxIn::SEQUENCE_FINAL",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                  ,0x3d9,
                  "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
                 );
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                ,0x3df,
                "void wallet::DiscourageFeeSniping(CMutableTransaction &, FastRandomContext &, interfaces::Chain &, const uint256 &, int)"
               );
}

Assistant:

static void DiscourageFeeSniping(CMutableTransaction& tx, FastRandomContext& rng_fast,
                                 interfaces::Chain& chain, const uint256& block_hash, int block_height)
{
    // All inputs must be added by now
    assert(!tx.vin.empty());
    // Discourage fee sniping.
    //
    // For a large miner the value of the transactions in the best block and
    // the mempool can exceed the cost of deliberately attempting to mine two
    // blocks to orphan the current best block. By setting nLockTime such that
    // only the next block can include the transaction, we discourage this
    // practice as the height restricted and limited blocksize gives miners
    // considering fee sniping fewer options for pulling off this attack.
    //
    // A simple way to think about this is from the wallet's point of view we
    // always want the blockchain to move forward. By setting nLockTime this
    // way we're basically making the statement that we only want this
    // transaction to appear in the next block; we don't want to potentially
    // encourage reorgs by allowing transactions to appear at lower heights
    // than the next block in forks of the best chain.
    //
    // Of course, the subsidy is high enough, and transaction volume low
    // enough, that fee sniping isn't a problem yet, but by implementing a fix
    // now we ensure code won't be written that makes assumptions about
    // nLockTime that preclude a fix later.
    if (IsCurrentForAntiFeeSniping(chain, block_hash)) {
        tx.nLockTime = block_height;

        // Secondly occasionally randomly pick a nLockTime even further back, so
        // that transactions that are delayed after signing for whatever reason,
        // e.g. high-latency mix networks and some CoinJoin implementations, have
        // better privacy.
        if (rng_fast.randrange(10) == 0) {
            tx.nLockTime = std::max(0, int(tx.nLockTime) - int(rng_fast.randrange(100)));
        }
    } else {
        // If our chain is lagging behind, we can't discourage fee sniping nor help
        // the privacy of high-latency transactions. To avoid leaking a potentially
        // unique "nLockTime fingerprint", set nLockTime to a constant.
        tx.nLockTime = 0;
    }
    // Sanity check all values
    assert(tx.nLockTime < LOCKTIME_THRESHOLD); // Type must be block height
    assert(tx.nLockTime <= uint64_t(block_height));
    for (const auto& in : tx.vin) {
        // Can not be FINAL for locktime to work
        assert(in.nSequence != CTxIn::SEQUENCE_FINAL);
        // May be MAX NONFINAL to disable both BIP68 and BIP125
        if (in.nSequence == CTxIn::MAX_SEQUENCE_NONFINAL) continue;
        // May be MAX BIP125 to disable BIP68 and enable BIP125
        if (in.nSequence == MAX_BIP125_RBF_SEQUENCE) continue;
        // The wallet does not support any other sequence-use right now.
        assert(false);
    }
}